

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generalizers.cpp
# Opt level: O3

bool set_location_window_from_val
               (Am_Object *locgen_window,Am_Inter_Location *current_val,Am_Value *old_val)

{
  bool value;
  am_loc_values *value_00;
  Am_Wrapper *value_01;
  Am_Slot_Key key;
  bool as_line;
  int d;
  int c;
  int b;
  int a;
  Am_Object ref_obj;
  ostrstream oss;
  char line [250];
  bool local_2a9;
  int local_2a8;
  int local_2a4;
  int local_2a0;
  int local_29c;
  Am_Object local_298;
  Am_Object local_290 [45];
  char local_128 [256];
  
  local_298.data = (Am_Object_Data *)0x0;
  Am_Inter_Location::Get_Location
            (current_val,&local_2a9,&local_298,&local_29c,&local_2a0,&local_2a4,&local_2a8);
  value = Am_Inter_Location::Get_Growing(current_val);
  if (local_2a9 == true) {
    std::ostrstream::ostrstream((ostrstream *)local_290,local_128,0xfa,_S_out);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_290,"Not yet implemented to generalize when as a line",0x30);
    std::ostream::put((char)local_290);
    Am_Pop_Up_Error_Window(local_128);
    std::ostrstream::~ostrstream((ostrstream *)local_290);
  }
  else {
    value_00 = create_loc_values(current_val,old_val);
    Am_Object::Set(locgen_window,0xfa,value_00,0);
    key = (Am_Slot_Key)locgen_window;
    Am_Object::Get_Object(local_290,key,(ulong)Am_CHANGE_LEFT);
    Am_Object::Set(local_290,0x169,true,0);
    Am_Object::~Am_Object(local_290);
    Am_Object::Get_Object(local_290,key,(ulong)Am_LEFT_HOW);
    Am_Object::Set(local_290,0x169,10,0);
    Am_Object::~Am_Object(local_290);
    Am_Object::Get_Object(local_290,key,(ulong)Am_LEFT_AMOUNT_WIDGET);
    Am_Object::Set(local_290,0x169,local_29c,0);
    Am_Object::~Am_Object(local_290);
    Am_Object::Get_Object(local_290,key,(ulong)Am_CHANGE_TOP);
    Am_Object::Set(local_290,0x169,true,0);
    Am_Object::~Am_Object(local_290);
    Am_Object::Get_Object(local_290,key,(ulong)Am_TOP_HOW);
    Am_Object::Set(local_290,0x169,10,0);
    Am_Object::~Am_Object(local_290);
    Am_Object::Get_Object(local_290,key,(ulong)Am_TOP_AMOUNT_WIDGET);
    Am_Object::Set(local_290,0x169,local_2a0,0);
    Am_Object::~Am_Object(local_290);
    Am_Object::Get_Object(local_290,key,(ulong)Am_CHANGE_WIDTH);
    Am_Object::Set(local_290,0xcc,value,0);
    Am_Object::~Am_Object(local_290);
    Am_Object::Get_Object(local_290,key,(ulong)Am_CHANGE_WIDTH);
    Am_Object::Set(local_290,0x169,value,0);
    Am_Object::~Am_Object(local_290);
    Am_Object::Get_Object(local_290,key,(ulong)Am_WIDTH_HOW);
    Am_Object::Set(local_290,0x169,10,0);
    Am_Object::~Am_Object(local_290);
    Am_Object::Get_Object(local_290,key,(ulong)Am_WIDTH_AMOUNT_WIDGET);
    Am_Object::Set(local_290,0x169,local_2a4,0);
    Am_Object::~Am_Object(local_290);
    Am_Object::Get_Object(local_290,key,(ulong)Am_CHANGE_HEIGHT);
    Am_Object::Set(local_290,0xcc,value,0);
    Am_Object::~Am_Object(local_290);
    Am_Object::Get_Object(local_290,key,(ulong)Am_CHANGE_HEIGHT);
    Am_Object::Set(local_290,0x169,value,0);
    Am_Object::~Am_Object(local_290);
    Am_Object::Get_Object(local_290,key,(ulong)Am_HEIGHT_HOW);
    Am_Object::Set(local_290,0x169,10,0);
    Am_Object::~Am_Object(local_290);
    Am_Object::Get_Object(local_290,key,(ulong)Am_HEIGHT_AMOUNT_WIDGET);
    Am_Object::Set(local_290,0x169,local_2a8,0);
    Am_Object::~Am_Object(local_290);
    Am_Object::Get_Object(local_290,key,(ulong)Am_CONSTANT_OBJECTS_WIDGET);
    Am_Object::Set(local_290,0x169,"",0);
    Am_Object::~Am_Object(local_290);
    value_01 = Am_Inter_Location::operator_cast_to_Am_Wrapper_(current_val);
    Am_Object::Set(locgen_window,0x169,value_01,0);
  }
  Am_Object::~Am_Object(&local_298);
  return (bool)(local_2a9 ^ 1);
}

Assistant:

bool
set_location_window_from_val(Am_Object &locgen_window,
                             Am_Inter_Location &current_val, Am_Value &old_val)
{
  bool as_line;
  int a, b, c, d;
  Am_Object ref_obj;
  current_val.Get_Location(as_line, ref_obj, a, b, c, d);
  bool growing = current_val.Get_Growing();
  if (as_line) {
    AM_POP_UP_ERROR_WINDOW("Not yet implemented to generalize when as a line");
    return false;
  }

  am_loc_values *loc_values = create_loc_values(current_val, old_val);
  locgen_window.Set(Am_VALUES, (Am_Ptr)loc_values);

  locgen_window.Get_Object(Am_CHANGE_LEFT).Set(Am_VALUE, true);
  locgen_window.Get_Object(Am_LEFT_HOW).Set(Am_VALUE, am_change_equals);
  locgen_window.Get_Object(Am_LEFT_AMOUNT_WIDGET).Set(Am_VALUE, a);

  locgen_window.Get_Object(Am_CHANGE_TOP).Set(Am_VALUE, true);
  locgen_window.Get_Object(Am_TOP_HOW).Set(Am_VALUE, am_change_equals);
  locgen_window.Get_Object(Am_TOP_AMOUNT_WIDGET).Set(Am_VALUE, b);

  locgen_window.Get_Object(Am_CHANGE_WIDTH).Set(Am_ACTIVE, growing);
  locgen_window.Get_Object(Am_CHANGE_WIDTH).Set(Am_VALUE, growing);
  locgen_window.Get_Object(Am_WIDTH_HOW).Set(Am_VALUE, am_change_equals);
  locgen_window.Get_Object(Am_WIDTH_AMOUNT_WIDGET).Set(Am_VALUE, c);

  locgen_window.Get_Object(Am_CHANGE_HEIGHT).Set(Am_ACTIVE, growing);
  locgen_window.Get_Object(Am_CHANGE_HEIGHT).Set(Am_VALUE, growing);
  locgen_window.Get_Object(Am_HEIGHT_HOW).Set(Am_VALUE, am_change_equals);
  locgen_window.Get_Object(Am_HEIGHT_AMOUNT_WIDGET).Set(Am_VALUE, d);

  locgen_window.Get_Object(Am_CONSTANT_OBJECTS_WIDGET).Set(Am_VALUE, "");

  locgen_window.Set(Am_VALUE, current_val);

  return true;
}